

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4b12d7::LosslessTestLarge::TestLosslessEncodingCtrl(LosslessTestLarge *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  LosslessTestLarge *in_RDI;
  AssertionResult gtest_ar;
  double psnr_lossless;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  aom_rational timebase;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffed4;
  double *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  string *file_name;
  Type type;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int local_c4;
  Message *in_stack_ffffffffffffff48;
  TestPartResultReporterInterface *in_stack_ffffffffffffff50;
  undefined1 local_91 [33];
  undefined1 local_70 [96];
  undefined8 local_10;
  
  local_10 = 0x3b9aca0001fca055;
  (in_RDI->super_EncoderTest).cfg_.g_timebase.num = 0x1fca055;
  (in_RDI->super_EncoderTest).cfg_.g_timebase.den = 1000000000;
  (in_RDI->super_EncoderTest).cfg_.rc_target_bitrate = 2000;
  (in_RDI->super_EncoderTest).cfg_.g_lag_in_frames = 0x19;
  (in_RDI->super_EncoderTest).cfg_.rc_min_quantizer = 10;
  (in_RDI->super_EncoderTest).cfg_.rc_max_quantizer = 0x14;
  (in_RDI->super_EncoderTest).init_flags_ = 0x10000;
  file_name = (string *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_91 + 1),"hantro_collage_w352h288.yuv",(allocator *)file_name);
  uVar3 = 5;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_ffffffffffffff00,file_name,(uint)((ulong)in_RDI >> 0x20),
             (uint)in_RDI,
             CONCAT13(in_stack_fffffffffffffeef,
                      CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)),
             in_stack_fffffffffffffee8,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  type = (Type)((ulong)file_name >> 0x20);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff00)
    ;
    in_stack_fffffffffffffeee = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffeee) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_70);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff40);
    if (bVar2) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
    if (local_c4 == 0) {
      GetMinPsnr(in_RDI);
      testing::internal::CmpHelperGE<double,int>
                ((char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeee,
                                                 CONCAT24(in_stack_fffffffffffffeec,local_c4))),
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (int *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff10);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff00);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x58f99b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffffff00,type,(char *)in_RDI,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)),
                   message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
        testing::Message::~Message((Message *)0x58f9e9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x58fa4b);
      goto LAB_0058fa53;
    }
    if (local_c4 != 2) goto LAB_0058fa53;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff00);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff00,type,(char *)in_RDI,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)),
             in_stack_fffffffffffffee0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
  testing::Message::~Message((Message *)0x58f8ea);
LAB_0058fa53:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x58fa60);
  return;
}

Assistant:

void LosslessTestLarge::TestLosslessEncodingCtrl() {
  const aom_rational timebase = { 33333333, 1000000000 };
  cfg_.g_timebase = timebase;
  cfg_.rc_target_bitrate = 2000;
  cfg_.g_lag_in_frames = 25;
  // Intentionally set Q > 0, to make sure control can be used to activate
  // lossless
  cfg_.rc_min_quantizer = 10;
  cfg_.rc_max_quantizer = 20;

  init_flags_ = AOM_CODEC_USE_PSNR;

  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     timebase.den, timebase.num, 0, 5);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr_lossless = GetMinPsnr();
  EXPECT_GE(psnr_lossless, kMaxPsnr);
}